

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandDrwsat(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  char *pcVar3;
  uint local_40;
  int c;
  int fVerbose;
  int fBalance;
  Abc_Ntk_t *pNtkRes;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  c = 0;
  local_40 = 0;
  Extra_UtilGetoptReset();
  while( true ) {
    while( true ) {
      iVar1 = Extra_UtilGetopt(argc,argv,"bvh");
      if (iVar1 == -1) {
        if (pAVar2 == (Abc_Ntk_t *)0x0) {
          Abc_Print(-1,"Empty network.\n");
          pAbc_local._4_4_ = 1;
        }
        else {
          iVar1 = Abc_NtkIsStrash(pAVar2);
          if (iVar1 == 0) {
            Abc_Print(-1,"This command works only for strashed networks.\n");
            pAbc_local._4_4_ = 1;
          }
          else {
            pAVar2 = Abc_NtkDrwsat(pAVar2,c,local_40);
            if (pAVar2 == (Abc_Ntk_t *)0x0) {
              Abc_Print(-1,"Command has failed.\n");
              pAbc_local._4_4_ = 0;
            }
            else {
              Abc_FrameReplaceCurrentNetwork(pAbc,pAVar2);
              pAbc_local._4_4_ = 0;
            }
          }
        }
        return pAbc_local._4_4_;
      }
      if (iVar1 != 0x62) break;
      c = c ^ 1;
    }
    if ((iVar1 == 0x68) || (iVar1 != 0x76)) break;
    local_40 = local_40 ^ 1;
  }
  Abc_Print(-2,"usage: drwsat [-bvh]\n");
  Abc_Print(-2,"\t         performs combinational AIG optimization for SAT\n");
  pcVar3 = "no";
  if (c != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-b     : toggle internal balancing [default = %s]\n",pcVar3);
  pcVar3 = "no";
  if (local_40 != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggle verbose printout [default = %s]\n",pcVar3);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandDrwsat( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int fBalance, fVerbose, c;

    extern Abc_Ntk_t * Abc_NtkDrwsat( Abc_Ntk_t * pNtk, int fBalance, int fVerbose );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    fBalance = 0;
    fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "bvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'b':
            fBalance ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "This command works only for strashed networks.\n" );
        return 1;
    }
    pNtkRes = Abc_NtkDrwsat( pNtk, fBalance, fVerbose );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Command has failed.\n" );
        return 0;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: drwsat [-bvh]\n" );
    Abc_Print( -2, "\t         performs combinational AIG optimization for SAT\n" );
    Abc_Print( -2, "\t-b     : toggle internal balancing [default = %s]\n", fBalance? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose printout [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}